

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vi.c
# Opt level: O1

el_action_t cv_action(EditLine *el,wint_t c)

{
  wchar_t wVar1;
  wchar_t *pwVar2;
  el_action_t eVar3;
  
  wVar1 = (el->el_chared).c_vcmd.action;
  if (wVar1 == L'\0') {
    (el->el_chared).c_vcmd.pos = (el->el_line).cursor;
    (el->el_chared).c_vcmd.action = c;
    eVar3 = '\x03';
  }
  else {
    eVar3 = '\x06';
    if (wVar1 == c) {
      if ((c & 4) == 0) {
        cv_undo(el);
      }
      pwVar2 = (el->el_line).buffer;
      cv_yank(el,pwVar2,(wchar_t)((ulong)((long)(el->el_line).lastchar - (long)pwVar2) >> 2));
      (el->el_chared).c_vcmd.action = L'\0';
      (el->el_chared).c_vcmd.pos = (wchar_t *)0x0;
      if ((c & 4) == 0) {
        pwVar2 = (el->el_line).buffer;
        (el->el_line).lastchar = pwVar2;
        (el->el_line).cursor = pwVar2;
      }
      eVar3 = '\x04';
      if ((c & 2) != 0) {
        (el->el_map).current = (el->el_map).key;
      }
    }
  }
  return eVar3;
}

Assistant:

static el_action_t
cv_action(EditLine *el, wint_t c)
{

	if (el->el_chared.c_vcmd.action != NOP) {
		/* 'cc', 'dd' and (possibly) friends */
		if (c != (wint_t)el->el_chared.c_vcmd.action)
			return CC_ERROR;

		if (!(c & YANK))
			cv_undo(el);
		cv_yank(el, el->el_line.buffer,
		    (int)(el->el_line.lastchar - el->el_line.buffer));
		el->el_chared.c_vcmd.action = NOP;
		el->el_chared.c_vcmd.pos = 0;
		if (!(c & YANK)) {
			el->el_line.lastchar = el->el_line.buffer;
			el->el_line.cursor = el->el_line.buffer;
		}
		if (c & INSERT)
			el->el_map.current = el->el_map.key;

		return CC_REFRESH;
	}
	el->el_chared.c_vcmd.pos = el->el_line.cursor;
	el->el_chared.c_vcmd.action = c;
	return CC_ARGHACK;
}